

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O2

void __thiscall
testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::Matcher
          (Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this,StringView s
          )

{
  allocator<char> local_79;
  string local_78 [32];
  string local_58 [32];
  MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = s._M_str;
  local_20._M_len = s._M_len;
  (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0014e738;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_78,&local_20,&local_79);
  std::__cxx11::string::string(local_58,local_78);
  internal::ComparisonBase::operator_cast_to_Matcher
            ((Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)&local_38,
             (ComparisonBase *)local_58);
  std::
  __shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&(this->
               super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).
               impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
              ,&local_38.impl_.
                super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
             );
  internal::MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::~MatcherBase
            (&local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

Matcher<const internal::StringView&>::Matcher(internal::StringView s) {
  *this = Eq(std::string(s));
}